

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.cc
# Opt level: O0

int __thiscall
webrtc::Resampler::ResetIfNeeded(Resampler *this,int inFreq,int outFreq,size_t num_channels)

{
  int tmpOutFreq_kHz;
  int tmpInFreq_kHz;
  size_t num_channels_local;
  int outFreq_local;
  int inFreq_local;
  Resampler *this_local;
  
  if (((inFreq / 1000 == this->my_in_frequency_khz_) &&
      (outFreq / 1000 == this->my_out_frequency_khz_)) && (num_channels == this->num_channels_)) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = Reset(this,inFreq,outFreq,num_channels);
  }
  return this_local._4_4_;
}

Assistant:

int Resampler::ResetIfNeeded(int inFreq, int outFreq, size_t num_channels)
{
    int tmpInFreq_kHz = inFreq / 1000;
    int tmpOutFreq_kHz = outFreq / 1000;

    if ((tmpInFreq_kHz != my_in_frequency_khz_) || (tmpOutFreq_kHz != my_out_frequency_khz_)
            || (num_channels != num_channels_))
    {
        return Reset(inFreq, outFreq, num_channels);
    } else
    {
        return 0;
    }
}